

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

void __thiscall
cfd::core::SetKeyPathMap
          (core *this,vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list,
          wally_map *map_obj)

{
  undefined8 uVar1;
  bool bVar2;
  uchar *fingerprint;
  size_t sVar3;
  CfdException *this_00;
  value_type_conflict *__val;
  pointer puVar4;
  int ret;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  ByteData fp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_vec;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  int local_bc;
  wally_map *local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  KeyData *local_98;
  Pubkey local_90;
  Pubkey local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  ByteData local_48;
  
  if (this != (core *)key_list) {
    local_b8 = map_obj;
    local_98 = (KeyData *)key_list;
    do {
      KeyData::GetPubkey(&local_78,(KeyData *)this);
      Pubkey::GetData((ByteData *)local_e8,&local_78);
      ByteData::GetBytes(&local_60,(ByteData *)local_e8);
      if ((uchar *)local_e8._0_8_ != (uchar *)0x0) {
        operator_delete((void *)local_e8._0_8_);
      }
      if (local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      fingerprint = (uchar *)operator_new(4);
      fingerprint[0] = '\0';
      fingerprint[1] = '\0';
      fingerprint[2] = '\0';
      fingerprint[3] = '\0';
      KeyData::GetFingerprint(&local_78.data_,(KeyData *)this);
      KeyData::GetChildNumArray(&local_b0,(KeyData *)this);
      bVar2 = ByteData::IsEmpty(&local_78.data_);
      if ((bVar2) &&
         (local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        KeyData::GetPubkey(&local_90,(KeyData *)this);
        Pubkey::GetFingerprint(&local_48,&local_90,4);
        ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8,
                           &local_48);
        uVar1 = local_e8._0_8_;
        local_e8._0_8_ = (uchar *)0x0;
        local_e8._8_8_ = (pointer)0x0;
        local_d8._M_allocated_capacity = 0;
        operator_delete(fingerprint);
        if ((uchar *)local_e8._0_8_ != (uchar *)0x0) {
          operator_delete((void *)local_e8._0_8_);
        }
        puVar4 = local_90.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        fingerprint = (uchar *)uVar1;
        if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
          puVar4 = local_90.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
LAB_003424f7:
        if (puVar4 != (uchar *)0x0) {
          operator_delete(puVar4);
        }
      }
      else {
        sVar3 = ByteData::GetDataSize(&local_78.data_);
        if (3 < sVar3) {
          ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8,
                             &local_78.data_);
          uVar1 = local_e8._0_8_;
          local_e8._0_8_ = (uchar *)0x0;
          local_e8._8_8_ = (pointer)0x0;
          local_d8._M_allocated_capacity = 0;
          operator_delete(fingerprint);
          puVar4 = (pointer)local_e8._0_8_;
          fingerprint = (uchar *)uVar1;
          goto LAB_003424f7;
        }
      }
      local_bc = wally_map_add_keypath_item
                           (local_b8,local_60.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_60.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_60.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,fingerprint,4,
                            local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_b0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_b0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2);
      if (local_bc != 0) {
        wally_map_free(local_b8);
        local_e8._0_8_ = "cfdcore_psbt.cpp";
        local_e8._8_4_ = 0x44;
        local_d8._M_allocated_capacity = 0x5d910f;
        logger::log<int&>((CfdSourceLocation *)local_e8,kCfdLogLevelWarning,
                          "wally_map_add_keypath_item NG[{}]",&local_bc);
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        local_e8._0_8_ = &local_d8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_e8,"psbt add keypath error.","");
        CfdException::CfdException(this_00,kCfdMemoryFullError,(string *)local_e8);
        __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (uint32_t *)0x0) {
        operator_delete(local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (fingerprint != (uchar *)0x0) {
        operator_delete(fingerprint);
      }
      if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      this = (core *)((long)this + 0x150);
    } while ((KeyData *)this != local_98);
  }
  return;
}

Assistant:

static void SetKeyPathMap(
    const std::vector<KeyData> &key_list, struct wally_map *map_obj) {
  int ret;
  for (auto &key : key_list) {
    auto key_vec = key.GetPubkey().GetData().GetBytes();
    std::vector<uint8_t> fingerprint(4);
    auto fp = key.GetFingerprint();
    auto path = key.GetChildNumArray();
    if (fp.IsEmpty() && path.empty()) {
      fingerprint = key.GetPubkey().GetFingerprint().GetBytes();
    } else if (fp.GetDataSize() >= 4) {
      fingerprint = fp.GetBytes();
    }

    ret = wally_map_add_keypath_item(
        map_obj, key_vec.data(), key_vec.size(), fingerprint.data(), 4,
        path.data(), path.size());
    if (ret != WALLY_OK) {
      wally_map_free(map_obj);
      warn(CFD_LOG_SOURCE, "wally_map_add_keypath_item NG[{}]", ret);
      throw CfdException(kCfdMemoryFullError, "psbt add keypath error.");
    }
  }
}